

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerApp::OnDatasetChanged(CommissionerApp *this)

{
  element_type *peVar1;
  CommissionerApp *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  CommissionerApp *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  peVar1 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20 = 0;
  local_10 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1330:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1330:9)>
             ::_M_manager;
  local_28 = this;
  (*peVar1->_vptr_Commissioner[0x19])(peVar1,&local_28,0xffff);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  peVar1 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = 0;
  local_30 = std::
             _Function_handler<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1344:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1344:9)>
             ::_M_manager;
  local_48 = this;
  (*peVar1->_vptr_Commissioner[0x1f])(peVar1,&local_48,0xffff);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

void CommissionerApp::OnDatasetChanged()
{
    mCommissioner->GetActiveDataset(
        [this](const ActiveOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mActiveDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);

    mCommissioner->GetPendingDataset(
        [this](const PendingOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mPendingDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);
}